

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jint Java_beagle_BeagleJNIWrapper_setEigenDecomposition
               (JNIEnv *env,jobject obj,jint instance,jint eigenIndex,jdoubleArray inEigenVectors,
               jdoubleArray inInvEigenVectors,jdoubleArray inEigenValues)

{
  jint mode;
  JNIEnv_ *this;
  jdoubleArray array;
  jdouble *elems;
  undefined4 in_ECX;
  undefined4 in_EDX;
  jint errCode;
  jdouble *eigenValues;
  jdouble *invEigenVectors;
  jdouble *eigenVectors;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  JNIEnv_ *in_stack_ffffffffffffffc0;
  
  this = (JNIEnv_ *)
         JNIEnv_::GetDoubleArrayElements
                   (in_stack_ffffffffffffffc0,
                    (jdoubleArray)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (jboolean *)0x104f88);
  array = (jdoubleArray)
          JNIEnv_::GetDoubleArrayElements
                    (in_stack_ffffffffffffffc0,
                     (jdoubleArray)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (jboolean *)0x104fa0);
  elems = JNIEnv_::GetDoubleArrayElements
                    (in_stack_ffffffffffffffc0,
                     (jdoubleArray)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (jboolean *)0x104fb8);
  mode = beagleSetEigenDecomposition(in_EDX,in_ECX,this,array,elems);
  JNIEnv_::ReleaseDoubleArrayElements(this,array,elems,mode);
  JNIEnv_::ReleaseDoubleArrayElements(this,array,elems,mode);
  JNIEnv_::ReleaseDoubleArrayElements(this,array,elems,mode);
  return mode;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_setEigenDecomposition
(JNIEnv *env, jobject obj, jint instance, jint eigenIndex, jdoubleArray inEigenVectors, jdoubleArray inInvEigenVectors, jdoubleArray inEigenValues)
{
    jdouble *eigenVectors = env->GetDoubleArrayElements(inEigenVectors, NULL);
    jdouble *invEigenVectors = env->GetDoubleArrayElements(inInvEigenVectors, NULL);
    jdouble *eigenValues = env->GetDoubleArrayElements(inEigenValues, NULL);

	jint errCode = (jint)beagleSetEigenDecomposition(instance, eigenIndex, (double *)eigenVectors, (double *)invEigenVectors, (double *)eigenValues);

    env->ReleaseDoubleArrayElements(inEigenValues, eigenValues, JNI_ABORT);
    env->ReleaseDoubleArrayElements(inInvEigenVectors, invEigenVectors, JNI_ABORT);
    env->ReleaseDoubleArrayElements(inEigenVectors, eigenVectors, JNI_ABORT);

    return errCode;
}